

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::onUnavailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  mutex_type *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffffd0;
  CountersReader *in_stack_ffffffffffffffd8;
  function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_stack_ffffffffffffffd0,in_RDI);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(long)in_stack_ffffffffffffffd0,
             (int)((ulong)in_RDI >> 0x20));
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f64d8);
  return;
}

Assistant:

void ClientConductor::onUnavailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    m_onUnavailableCounterHandler(m_countersReader, registrationId, counterId);
}